

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O2

void __thiscall QPlainTextEdit::wheelEvent(QPlainTextEdit *this,QWheelEvent *e)

{
  TextInteractionFlags TVar1;
  
  TVar1 = QWidgetTextControl::textInteractionFlags
                    (*(QWidgetTextControl **)
                      (*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.
                                 field_0x8 + 800));
  if ((((uint)TVar1.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
              super_QFlagsStorage<Qt::TextInteractionFlag>.i & 0x10) == 0) &&
     (((byte)e[0x23] & 4) != 0)) {
    zoomInF(this,(float)*(int *)(e + 0x5c) / 120.0);
    return;
  }
  QAbstractScrollArea::wheelEvent((QAbstractScrollArea *)this,e);
  QWidget::updateMicroFocus((QWidget *)this,ImQueryAll);
  return;
}

Assistant:

void QPlainTextEdit::wheelEvent(QWheelEvent *e)
{
    Q_D(QPlainTextEdit);
    if (!(d->control->textInteractionFlags() & Qt::TextEditable)) {
        if (e->modifiers() & Qt::ControlModifier) {
            float delta = e->angleDelta().y() / 120.f;
            zoomInF(delta);
            return;
        }
    }
    QAbstractScrollArea::wheelEvent(e);
    updateMicroFocus();
}